

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O0

void __thiscall Fl_Help_View::topline(Fl_Help_View *this,char *n)

{
  void *pvVar1;
  Fl_Help_Target *target;
  Fl_Help_Target key;
  char *n_local;
  Fl_Help_View *this_local;
  
  if (this->ntargets_ != 0) {
    key._28_8_ = n;
    fl_strlcpy((char *)((long)&target + 4),n,0x20);
    pvVar1 = bsearch((void *)((long)&target + 4),this->targets_,(long)this->ntargets_,0x24,
                     compare_targets);
    if (pvVar1 != (void *)0x0) {
      topline(this,*(int *)((long)pvVar1 + 0x20));
    }
  }
  return;
}

Assistant:

void
Fl_Help_View::topline(const char *n)	// I - Target name
{
  Fl_Help_Target key,			// Target name key
		*target;		// Pointer to matching target


  if (ntargets_ == 0)
    return;

  strlcpy(key.name, n, sizeof(key.name));

  target = (Fl_Help_Target *)bsearch(&key, targets_, ntargets_, sizeof(Fl_Help_Target),
                                 (compare_func_t)compare_targets);

  if (target != NULL)
    topline(target->y);
}